

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nrom.cpp
# Opt level: O0

uint8_t __thiscall n_e_s::core::Nrom::cpu_read_byte(Nrom *this,uint16_t addr)

{
  code *pcVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint16_t addr_local;
  Nrom *this_local;
  
  if (addr < 0x8000) {
    if (SBORROW4((uint)addr,0x6000)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->prg_ram_);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->prg_ram_,(ulong)(ushort)(addr + 0xa000) % sVar2);
    this_local._7_1_ = *pvVar3;
  }
  else {
    if (SBORROW4((uint)addr,0x8000)) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->prg_rom_);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->prg_rom_,(ulong)(ushort)(addr + 0x8000) % sVar2);
    this_local._7_1_ = *pvVar3;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t Nrom::cpu_read_byte(uint16_t addr) const {
    if (addr <= kPrgRamEnd) {
        addr -= kPrgRamStart;
        return prg_ram_[addr % prg_ram_.size()];
    }

    addr -= kPrgRomStart;
    return prg_rom_[addr % prg_rom_.size()];
}